

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void unpack_cell(int i,int j,int k,vector<int,_std::allocator<int>_> *particle_numbers,
                size_t *pn_index,vector<particle,_std::allocator<particle>_> *particles,
                size_t *p_index)

{
  pointer ppVar1;
  double *pdVar2;
  pointer ppVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  undefined8 uVar16;
  particle *ppVar17;
  particle *ppVar18;
  size_t sVar19;
  particle *ppVar20;
  int iVar21;
  plist *a;
  
  a = (plist *)((long)k * 0x10 +
               *(long *)(*(long *)(*(long *)((long)psr._M_t.
                                                  super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                                                  .super__Head_base<0UL,_spatial_region_*,_false>.
                                                  _M_head_impl + 0x218) + (long)i * 8) + (long)j * 8
                        ));
  spatial_region::erase
            ((spatial_region *)
             psr._M_t.super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
             _M_t.super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
             super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,a);
  sVar19 = *pn_index;
  if (0 < (particle_numbers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start[sVar19]) {
    iVar21 = 0;
    do {
      ppVar18 = spatial_region::new_particle
                          ((spatial_region *)
                           psr._M_t.
                           super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                           .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl);
      sVar19 = *p_index;
      *p_index = sVar19 + 1;
      ppVar3 = (particles->super__Vector_base<particle,_std::allocator<particle>_>)._M_impl.
               super__Vector_impl_data._M_start;
      ppVar1 = ppVar3 + sVar19;
      dVar4 = ppVar1->y;
      dVar5 = ppVar1->z;
      dVar6 = ppVar1->ux;
      dVar7 = ppVar1->uy;
      dVar8 = ppVar1->uz;
      dVar9 = ppVar1->g;
      dVar10 = ppVar1->q;
      pdVar2 = &ppVar3[sVar19].uz;
      dVar11 = *pdVar2;
      dVar12 = pdVar2[1];
      dVar13 = pdVar2[2];
      dVar14 = pdVar2[3];
      dVar15 = pdVar2[4];
      uVar16 = pdVar2[5];
      ppVar17 = (particle *)pdVar2[6];
      ppVar20 = (particle *)pdVar2[7];
      ppVar18->x = ppVar1->x;
      ppVar18->y = dVar4;
      ppVar18->z = dVar5;
      ppVar18->ux = dVar6;
      ppVar18->uy = dVar7;
      ppVar18->uz = dVar8;
      ppVar18->g = dVar9;
      ppVar18->q = dVar10;
      ppVar18->uz = dVar11;
      ppVar18->g = dVar12;
      ppVar18->q = dVar13;
      ppVar18->cmr = dVar14;
      ppVar18->chi = dVar15;
      *(undefined8 *)&ppVar18->trn = uVar16;
      ppVar18->next = ppVar17;
      ppVar18->previous = ppVar20;
      ppVar18->previous = a->start;
      a->start = ppVar18;
      iVar21 = iVar21 + 1;
      sVar19 = *pn_index;
    } while (iVar21 < (particle_numbers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start[sVar19]);
  }
  a->head = (particle *)0x0;
  if (a->start != (particle *)0x0) {
    ppVar17 = a->start;
    ppVar20 = a->head;
    do {
      ppVar18 = ppVar17;
      ppVar18->next = ppVar20;
      ppVar17 = ppVar18->previous;
      ppVar20 = ppVar18;
    } while (ppVar18->previous != (particle *)0x0);
    a->head = ppVar18;
    a->start = (particle *)0x0;
  }
  a->start = a->head;
  *pn_index = sVar19 + 1;
  return;
}

Assistant:

void unpack_cell(int i, int j, int k, vector<int> & particle_numbers, size_t & pn_index, vector<particle> & particles, size_t & p_index) {
    plist & pl = psr->cp[i][j][k].pl;
    psr->erase(pl);

    for (int ii=0; ii<particle_numbers[pn_index]; ii++) {
        particle * tmp = psr->new_particle();
        *tmp = particles[p_index++];
        tmp->previous = pl.start;
        pl.start = tmp;
    }
    pl.head = 0;
    while (pl.start != 0) {
        pl.start->next = pl.head;
        pl.head = pl.start;
        pl.start = pl.start->previous;
    }
    pl.start = pl.head;

    pn_index++;
}